

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * __thiscall
cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,char *fname,char *directory,
          char *toplevel)

{
  size_type sVar1;
  bool bVar2;
  size_t sVar3;
  string dir;
  string prevDir;
  string file;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,(char *)this,(allocator *)&local_b0);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_70);
  std::__cxx11::string::string((string *)&local_b0,fname,(allocator *)&local_90);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_b0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  do {
    bVar2 = std::operator!=(&local_b0,&local_90);
    if (!bVar2) {
LAB_0035a403:
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
LAB_0035a417:
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      return __return_storage_ptr__;
    }
    std::operator+(&local_50,&local_b0,"/");
    std::operator+(__return_storage_ptr__,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = cmsys::SystemTools::FileExists((__return_storage_ptr__->_M_dataplus)._M_p);
    sVar1 = local_b0._M_string_length;
    if (bVar2) goto LAB_0035a417;
    sVar3 = strlen(directory);
    if (sVar1 < sVar3) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      goto LAB_0035a403;
    }
    std::__cxx11::string::_M_assign((string *)&local_90);
    cmsys::SystemTools::GetParentDirectory(&local_50,&local_b0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  } while( true );
}

Assistant:

std::string cmSystemTools::FileExistsInParentDirectories(const char* fname,
  const char* directory, const char* toplevel)
{
  std::string file = fname;
  cmSystemTools::ConvertToUnixSlashes(file);
  std::string dir = directory;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::string prevDir;
  while(dir != prevDir)
    {
    std::string path = dir + "/" + file;
    if ( cmSystemTools::FileExists(path.c_str()) )
      {
      return path;
      }
    if ( dir.size() < strlen(toplevel) )
      {
      break;
      }
    prevDir = dir;
    dir = cmSystemTools::GetParentDirectory(dir);
    }
  return "";
}